

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8_fp16.h
# Opt level: O3

void ncnn::conv1x1s2_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  uint _c;
  int _w;
  int _h;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  Mat local_78;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar6 = 0;
    do {
      if (0 < _h) {
        puVar7 = (undefined8 *)
                 (local_78.cstep * uVar6 *
                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                 (long)local_78.data);
        puVar8 = (undefined8 *)
                 (bottom_blob->cstep * uVar6 * bottom_blob->elemsize + (long)bottom_blob->data);
        iVar9 = 0;
        do {
          iVar10 = _w;
          if (0 < _w) {
            do {
              uVar2 = puVar8[1];
              uVar3 = puVar8[2];
              uVar4 = puVar8[3];
              *puVar7 = *puVar8;
              puVar7[1] = uVar2;
              puVar7[2] = uVar3;
              puVar7[3] = uVar4;
              puVar8 = puVar8 + 8;
              puVar7 = puVar7 + 4;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          puVar8 = (undefined8 *)((long)puVar8 + (long)((iVar1 - _w) * 0x10) * 4);
          iVar9 = iVar9 + 1;
        } while (iVar9 != _h);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != _c);
  }
  conv1x1s1_sgemm_fp16_pack8_avx
            (&local_78,top_blob,kernel,(Mat *)_bias->data,(Option *)opt->workspace_allocator);
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _v = _mm256_loadu_ps(r0);
                _mm256_storeu_ps(outptr, _v);

                r0 += 16;
                outptr += 8;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_fp16_pack8_avx(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}